

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select.c
# Opt level: O1

pattern * getPat(char *line,char *which,int verbose)

{
  pattern *ppVar1;
  
  if (line == (char *)0x0) {
    ppVar1 = (pattern *)0x0;
  }
  else {
    ppVar1 = parseArg(line);
    if (ppVar1 != (pattern *)0x0 && verbose != 0) {
      getPat_cold_1();
    }
  }
  return ppVar1;
}

Assistant:

pattern* getPat(char *line, char *which, int verbose)
{
   pattern *pat;

   if (!line) return NULL;

   pat = parseArg(line);  /* parse.c/parseArg() */

   if (verbose && pat) {
      fprintf(stderr, "%s: ", which);
      printPattern(stderr, pat); /* parse.c/printPattern() */
   }

   return pat;
}